

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

Endpoint * __thiscall
helics::MessageFederateManager::registerDataSink(MessageFederateManager *this,string_view name)

{
  string_view message;
  string_view searchValue1;
  bool bVar1;
  unsigned_long *puVar2;
  undefined8 uVar3;
  InterfaceHandle *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  optional<unsigned_long> oVar4;
  value_type *edat;
  handle datHandle;
  Endpoint *ref;
  optional<unsigned_long> loc;
  handle eptHandle;
  InterfaceHandle handle;
  lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  *in_stack_ffffffffffffff00;
  reference in_stack_ffffffffffffff08;
  Endpoint *in_stack_ffffffffffffff10;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int iVar5;
  MessageFederate **in_stack_ffffffffffffff50;
  pointer in_stack_ffffffffffffff58;
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  Endpoint *pEVar6;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  local_50;
  undefined4 local_28;
  InterfaceHandle local_24 [5];
  InterfaceHandle *pIStack_10;
  Endpoint *local_8;
  
  local_28 = *(undefined4 *)(in_RDI + 0x170);
  pIStack_10 = in_RDX;
  local_24[0].hid =
       (**(code **)(**(long **)(in_RDI + 0x160) + 0x1c0))
                 (*(long **)(in_RDI + 0x160),local_28,in_RSI,in_RDX);
  bVar1 = InterfaceHandle::isValid(local_24);
  if (bVar1) {
    in_stack_ffffffffffffff18 = &local_50;
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(in_stack_ffffffffffffff38);
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::operator->(in_stack_ffffffffffffff18);
    searchValue1._M_str = in_stack_ffffffffffffff70;
    searchValue1._M_len = in_stack_ffffffffffffff68;
    oVar4 = gmlc::containers::
            DualStringMappedVector<helics::Endpoint,helics::InterfaceHandle,(reference_stability)0,5>
            ::
            insert<helics::MessageFederate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
                      (in_stack_ffffffffffffff60,searchValue1,
                       (InterfaceHandle *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),pIStack_10);
    in_stack_ffffffffffffff27 =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x36ba98);
    if (bVar1) {
      gmlc::libguarded::
      lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
      ::operator->(&local_50);
      in_stack_ffffffffffffff10 =
           gmlc::containers::
           DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
           ::back((DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
                   *)0x36bab6);
      in_stack_ffffffffffffff10->receiveOnly = true;
      pEVar6 = in_stack_ffffffffffffff10;
      gmlc::libguarded::
      shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
      ::lock((shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
              *)in_stack_ffffffffffffff38);
      gmlc::libguarded::
      lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
      ::operator->((lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
                    *)&stack0xffffffffffffff58);
      in_stack_ffffffffffffff08 =
           std::
           deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
           ::emplace_back<>((deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
                             *)in_stack_ffffffffffffff00);
      pEVar6->dataReference = in_stack_ffffffffffffff08;
      gmlc::libguarded::
      lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
      ::unlock(in_stack_ffffffffffffff00);
      puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x36bb32);
      pEVar6->referenceIndex = (int)*puVar2;
      iVar5 = 1;
      local_8 = pEVar6;
      gmlc::libguarded::
      lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
      ::~lock_handle((lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
                      *)0x36bb5e);
    }
    else {
      iVar5 = 0;
    }
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                    *)0x36bbab);
    if (iVar5 != 0) {
      return local_8;
    }
  }
  uVar3 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff10,
             (char *)in_stack_ffffffffffffff08);
  message._M_str._0_7_ = in_stack_ffffffffffffff20;
  message._M_len = (size_t)in_stack_ffffffffffffff18;
  message._M_str._7_1_ = in_stack_ffffffffffffff27;
  RegistrationFailure::RegistrationFailure((RegistrationFailure *)in_stack_ffffffffffffff10,message)
  ;
  __cxa_throw(uVar3,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
}

Assistant:

Endpoint& MessageFederateManager::registerDataSink(std::string_view name)
{
    auto handle = coreObject->registerDataSink(fedID, name);
    if (handle.isValid()) {
        auto eptHandle = mLocalEndpoints.lock();
        auto loc = eptHandle->insert(name, handle, mFed, name, handle);
        if (loc) {
            auto& ref = eptHandle->back();
            ref.receiveOnly = true;
            auto datHandle = eptData.lock();
            auto& edat = datHandle->emplace_back();

            // non-owning pointer
            ref.dataReference = &edat;
            datHandle.unlock();
            ref.referenceIndex = static_cast<int>(*loc);

            return ref;
        }
    }
    throw(RegistrationFailure("Unable to register Data Sink"));
}